

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_records_calendar_dates.c
# Opt level: O1

void CGTFS_DatabaseCalendarDates(void)

{
  int iVar1;
  feed_db_status_t fVar2;
  long lVar3;
  undefined4 *puVar4;
  calendar_date_t *pcVar5;
  byte bVar6;
  feed_db_t db;
  feed_db_t fStack_a8;
  calendar_date_t local_80;
  
  bVar6 = 0;
  iVar1 = greatest_test_pre("db_calendar_dates_store");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      puVar4 = &DAT_001e9128;
      pcVar5 = &local_80;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)pcVar5->service_id = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        pcVar5 = (calendar_date_t *)((long)pcVar5 + (ulong)bVar6 * -8 + 4);
      }
      init_feed_db(&fStack_a8,"tests_tdw0.db",1);
      setup_feed_db(&fStack_a8);
      fVar2 = store_calendar_dates_db(&local_80,&fStack_a8);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar2 == FEED_DB_SUCCESS) {
        free_feed_db(&fStack_a8);
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",1);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)fVar2);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_database_records/tests-database_records_calendar_dates.c"
        ;
        greatest_info.fail_line = 0x15;
        greatest_info.msg = fStack_a8.error_msg;
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
      }
    }
    greatest_test_post(iVar1);
  }
  return;
}

Assistant:

SUITE(CGTFS_DatabaseCalendarDates) {
    RUN_TEST(db_calendar_dates_store);
}